

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initializer.cpp
# Opt level: O3

void Am_Initializer::Do_Initialize(void)

{
  code *pcVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  p_Var2 = (_List_node_base *)am_initializer_list_abi_cxx11_;
  for (p_Var3 = (am_initializer_list_abi_cxx11_->
                super__List_base<Am_Initializer_*,_std::allocator<Am_Initializer_*>_>)._M_impl.
                _M_node.super__List_node_base._M_next; p_Var3 != p_Var2;
      p_Var3 = (((_List_base<Am_Initializer_*,_std::allocator<Am_Initializer_*>_> *)&p_Var3->_M_next
                )->_M_impl)._M_node.super__List_node_base._M_next) {
    pcVar1 = (code *)p_Var3[1]._M_next[1]._M_next;
    if (pcVar1 != (code *)0x0) {
      (*pcVar1)();
      p_Var2 = (_List_node_base *)am_initializer_list_abi_cxx11_;
    }
  }
  return;
}

Assistant:

void
Am_Initializer::Do_Initialize()
{
  for (INITIALIZERLIST::iterator it = am_initializer_list->begin();
       it != am_initializer_list->end(); ++it) {
    // check if we have a function to call
    if ((*it)->init != static_cast<Am_Initializer_Procedure *>(nullptr)) {
#ifdef LEAK_TRACE
      DERR("Initializing: " << (*it)->name << "\t\tPriority: "
                            << (*it)->priority << std::endl);
#endif
      // call the init() function stored in the Am_Initializer object
      (*it)->init();
    }
  }
}